

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMemClear(Mem *p)

{
  long in_RDI;
  void *in_stack_00000008;
  sqlite3 *in_stack_00000010;
  
  if ((*(ushort *)(in_RDI + 0x14) & 0x9000) != 0) {
    vdbeMemClearExternAndSetNull((Mem *)0x172d30);
  }
  if (*(int *)(in_RDI + 0x20) != 0) {
    sqlite3DbFreeNN(in_stack_00000010,in_stack_00000008);
    *(undefined4 *)(in_RDI + 0x20) = 0;
  }
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClear(Mem *p){
  if( VdbeMemDynamic(p) ){
    vdbeMemClearExternAndSetNull(p);
  }
  if( p->szMalloc ){
    sqlite3DbFreeNN(p->db, p->zMalloc);
    p->szMalloc = 0;
  }
  p->z = 0;
}